

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromCacheTest::createInstance
          (PipelineFromCacheTest *this,Context *context)

{
  PipelineFromCacheTestInstance *this_00;
  Context *context_local;
  PipelineFromCacheTest *this_local;
  
  this_00 = (PipelineFromCacheTestInstance *)operator_new(0x598);
  PipelineFromCacheTestInstance::PipelineFromCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* PipelineFromCacheTest::createInstance (Context& context) const
{
	return new PipelineFromCacheTestInstance(context, &m_param);
}